

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O1

string * GetDeepThoughtData_abi_cxx11_(string *__return_storage_ptr__,Data *data)

{
  pointer puVar1;
  int iVar2;
  pointer puVar3;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = GetDeepThoughtDataOffset(data);
  if (iVar2 != 0) {
    puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = puVar1 + iVar2;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,puVar3,
               puVar3 + ((*(int *)&(data->
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1) - iVar2
                        ));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetDeepThoughtData(const Data& data)
{
    std::string str;

    auto offset = GetDeepThoughtDataOffset(data);
    if (offset != 0)
        str = std::string(reinterpret_cast<const char*>(data.data() + offset), data.size() - offset);

    return str;
}